

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetAppendTxOutFundRawTx(void *handle,void *fund_handle,uint32_t index,char **append_address)

{
  undefined8 uVar1;
  size_type sVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  uint in_EDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiFundRawTxData *buffer;
  int result;
  size_type in_stack_fffffffffffffea8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffed0;
  CfdException *this;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  exception in_stack_ffffffffffffff17;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"FundRawTxData",&local_61);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (in_RCX == (undefined8 *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xd0b;
    local_80.funcname = "CfdGetAppendTxOutFundRawTx";
    cfd::core::logger::warn<>(&local_80,"append_address is null.");
    local_a2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. append_address is null.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffed0,error_code,in_stack_fffffffffffffec0);
    local_a2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(in_RSI + 0x50) != 0) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)(in_RSI + 0x50));
    if (in_EDX < sVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      pcVar3 = cfd::capi::CreateString
                         ((string *)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
      *in_RCX = pcVar3;
      return 0;
    }
  }
  local_c8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_c8.filename = local_c8.filename + 1;
  local_c8.line = 0xd15;
  local_c8.funcname = "CfdGetAppendTxOutFundRawTx";
  cfd::core::logger::warn<>(&local_c8,"target addresses is maximum over.");
  uVar1 = __cxa_allocate_exception(0x30);
  this = (CfdException *)&stack0xffffffffffffff17;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,"Failed to parameter. target addresses is maximum over.",(allocator *)this);
  cfd::core::CfdException::CfdException
            (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffec0);
  __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetAppendTxOutFundRawTx(
    void* handle, void* fund_handle, uint32_t index, char** append_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (append_address == nullptr) {
      warn(CFD_LOG_SOURCE, "append_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. append_address is null.");
    }

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if ((buffer->append_txout_addresses == nullptr) ||
        (index >= buffer->append_txout_addresses->size())) {
      warn(CFD_LOG_SOURCE, "target addresses is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target addresses is maximum over.");
    }

    *append_address = CreateString(buffer->append_txout_addresses->at(index));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}